

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.cc
# Opt level: O0

int test_next_on_maps(void)

{
  int iVar1;
  
  _plan(0x34,true);
  _space(_stdout);
  printf("# *** %s ***\n","test_next_on_maps");
  test_next_on_map(0);
  test_next_on_map(1);
  test_next_on_map(0xf);
  test_next_on_map(0x10);
  test_next_on_map(0x11);
  test_next_on_map(0xfe);
  test_next_on_map(0xff);
  test_next_on_map(0x100);
  test_next_on_map(0x101);
  test_next_on_map(0xfffe);
  test_next_on_map(0xffff);
  test_next_on_map(0x10000);
  test_next_on_map(0x10001);
  _space(_stdout);
  printf("# *** %s: done ***\n","test_next_on_maps");
  iVar1 = check_plan();
  return iVar1;
}

Assistant:

static int
test_next_on_maps(void)
{
	plan(52);
	header();

	test_next_on_map(0x00);
	test_next_on_map(0x01);
	test_next_on_map(0x0f);
	test_next_on_map(0x10);
	test_next_on_map(0x11);
	test_next_on_map(0xfe);
	test_next_on_map(0xff);
	test_next_on_map(0x100);
	test_next_on_map(0x101);
	test_next_on_map(0xfffe);
	test_next_on_map(0xffff);
	test_next_on_map(0x10000);
	test_next_on_map(0x10001);

	footer();
	return check_plan();
}